

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::ListFileScope::ListFileScope(ListFileScope *this,cmMakefile *mf,string *filenametoread)

{
  pointer ppcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  long entryPointLine;
  string name;
  string local_50;
  Snapshot local_30;
  
  this->Makefile = mf;
  this->ReportError = true;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  ppcVar1 = (mf->ContextStack).
            super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((mf->ContextStack).
      super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
      _M_impl.super__Vector_impl_data._M_start == ppcVar1) {
    entryPointLine = 0;
  }
  else {
    entryPointLine = ppcVar1[-1]->Line;
    std::__cxx11::string::_M_assign((string *)&local_50);
    mf = this->Makefile;
  }
  cmState::CreateInlineListFileSnapshot
            (&local_30,mf->GlobalGenerator->CMakeInstance->State,mf->StateSnapshot,&local_50,
             entryPointLine,filenametoread);
  pcVar2 = this->Makefile;
  (pcVar2->StateSnapshot).Position.Position = local_30.Position.Position;
  (pcVar2->StateSnapshot).State = local_30.State;
  (pcVar2->StateSnapshot).Position.Tree = local_30.Position.Tree;
  bVar3 = cmState::Snapshot::IsValid(&this->Makefile->StateSnapshot);
  if (bVar3) {
    PushFunctionBlockerBarrier(this->Makefile);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  __assert_fail("this->Makefile->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                ,0x1f7,"cmMakefile::ListFileScope::ListFileScope(cmMakefile *, const std::string &)"
               );
}

Assistant:

ListFileScope(cmMakefile* mf, std::string const& filenametoread)
    : Makefile(mf), ReportError(true)
  {
    long line = 0;
    std::string name;
    if (!this->Makefile->ContextStack.empty())
      {
      line = this->Makefile->ContextStack.back()->Line;
      name = this->Makefile->ContextStack.back()->Name;
      }
    this->Makefile->StateSnapshot =
        this->Makefile->GetState()->CreateInlineListFileSnapshot(
          this->Makefile->StateSnapshot, name, line, filenametoread);
    assert(this->Makefile->StateSnapshot.IsValid());

    this->Makefile->PushFunctionBlockerBarrier();
  }